

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_refreshing_subjects_which_are_not_already_registered_no_controls_and_new_edition_Test
::TestBody(SubjectSetRegisterTest_test_refreshing_subjects_which_are_not_already_registered_no_controls_and_new_edition_Test
           *this)

{
  bool bVar1;
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  *pmVar2;
  char *pcVar3;
  char *in_R9;
  string local_280;
  AssertHelper local_260;
  Message local_258;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar__1;
  Subject local_1c8 [24];
  string local_1b0;
  AssertHelper local_190;
  Message local_188;
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  Subject local_e0 [40];
  Subject local_b8 [24];
  SubjectSetRegister local_a0 [8];
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_test_refreshing_subjects_which_are_not_already_registered_no_controls_and_new_edition_Test
  *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_b8,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_b8,0);
  subject::Subject::~Subject(local_b8);
  bidfx_public_api::price::subject::Subject::Subject(local_e0,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_e0,1);
  subject::Subject::~Subject(local_e0);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)
             &message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register
            (local_a0,&message.
                       super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>
                       ._M_payload.
                       super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
                       .
                       super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>
                       ._M_engaged,1);
  subject::Subject::~Subject
            ((Subject *)
             &message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar_.message_);
  pmVar2 = (map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
            *)bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  local_179 = std::
              map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
              ::empty(pmVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_178,&local_179,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b0,(internal *)local_178,(AssertionResult *)"message->GetControls().empty()",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x23b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  bidfx_public_api::price::subject::Subject::Subject(local_1c8,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_1c8,1);
  subject::Subject::~Subject(local_1c8);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator=
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar_.message_,
             (optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar__1.message_);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar__1.message_);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar_.message_);
  pmVar2 = (map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
            *)bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  local_249 = std::
              map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
              ::empty(pmVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_248,&local_249,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_280,(internal *)local_248,(AssertionResult *)"message->GetControls().empty()",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x23f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar_.message_);
  SubjectSetRegister::~SubjectSetRegister(local_a0);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_refreshing_subjects_which_are_not_already_registered_no_controls_and_new_edition)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT0, true);
    subject_register.Register(SS_SUBJECT1, true);
    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    EXPECT_TRUE(message->GetControls().empty());

    subject_register.Register(SS_SUBJECT2, true);
    message = subject_register.NextSubscriptionSync();
    EXPECT_TRUE(message->GetControls().empty());
}